

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O0

int check24(aint val)

{
  char local_58 [8];
  char buffer [64];
  int local_c;
  aint val_local;
  
  if ((val < -0x1000000) || (0xffffff < val)) {
    snprintf(local_58,0x40,"value 0x%X is truncated to 24bit value: 0x%06X",(ulong)(uint)val,
             (ulong)(val & 0xffffff));
    Warning(local_58,(char *)0x0,W_PASS3);
    local_c = 0;
  }
  else {
    local_c = 1;
  }
  return local_c;
}

Assistant:

int check24(aint val) {
	if (val < -16777216 || val > 16777215) {
		char buffer[64];
		SPRINTF2(buffer, 64, "value 0x%X is truncated to 24bit value: 0x%06X", val, val&0xFFFFFF);
		Warning(buffer);
		return 0;
	}
	return 1;
}